

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_json_parser.h
# Opt level: O0

char * MyGame_Example_Vec3_parse_json_struct_inline
                 (flatcc_json_parser_t *ctx,char *buf,char *end,void *struct_base)

{
  char *pcVar1;
  float local_6c;
  float local_68;
  float val_4;
  float val_3;
  float val_2;
  double val_1;
  uint64_t uStack_50;
  int8_t val;
  uint64_t w;
  char *mark;
  void *pval;
  flatcc_builder_ref_t ref;
  int more;
  void *struct_base_local;
  char *end_local;
  char *buf_local;
  flatcc_json_parser_t *ctx_local;
  
  _ref = (char *)struct_base;
  struct_base_local = end;
  end_local = buf;
  buf_local = (char *)ctx;
  end_local = flatcc_json_parser_object_start(ctx,buf,end,(int *)((long)&pval + 4));
  do {
    if (pval._4_4_ == 0) {
      return end_local;
    }
    end_local = flatcc_json_parser_symbol_start
                          ((flatcc_json_parser_t *)buf_local,end_local,(char *)struct_base_local);
    uStack_50 = flatcc_json_parser_symbol_part(end_local,(char *)struct_base_local);
    if (uStack_50 < 0x7465737433000000) {
      if ((uStack_50 & 0xffffffffff000000) == 0x7465737432000000) {
        w = (uint64_t)end_local;
        end_local = flatcc_json_parser_match_symbol
                              ((flatcc_json_parser_t *)buf_local,end_local,(char *)struct_base_local
                               ,5);
        if ((char *)w == end_local) {
          end_local = flatcc_json_parser_unmatched_symbol
                                ((flatcc_json_parser_t *)buf_local,end_local,
                                 (char *)struct_base_local);
        }
        else {
          val_1._7_1_ = '\0';
          mark = _ref + 0x18;
          w = (uint64_t)end_local;
          end_local = flatcc_json_parser_int8
                                ((flatcc_json_parser_t *)buf_local,end_local,
                                 (char *)struct_base_local,(int8_t *)((long)&val_1 + 7));
          if (((char *)w == end_local) &&
             ((w = (uint64_t)end_local,
              end_local = flatcc_json_parser_symbolic_int8
                                    ((flatcc_json_parser_t *)buf_local,end_local,
                                     (char *)struct_base_local,
                                     MyGame_Example_Vec3_parse_json_struct_inline::symbolic_parsers,
                                     (int8_t *)((long)&val_1 + 7)), end_local == (char *)w ||
              (end_local == (char *)struct_base_local)))) {
LAB_0010f49d:
            pcVar1 = flatcc_json_parser_set_error
                               ((flatcc_json_parser_t *)buf_local,end_local,
                                (char *)struct_base_local,0x23);
            return pcVar1;
          }
          flatbuffers_int8_write_to_pe(mark,val_1._7_1_);
        }
      }
      else if ((uStack_50 & 0xffffffffff000000) == 0x7465737431000000) {
        w = (uint64_t)end_local;
        end_local = flatcc_json_parser_match_symbol
                              ((flatcc_json_parser_t *)buf_local,end_local,(char *)struct_base_local
                               ,5);
        if ((char *)w == end_local) {
          end_local = flatcc_json_parser_unmatched_symbol
                                ((flatcc_json_parser_t *)buf_local,end_local,
                                 (char *)struct_base_local);
        }
        else {
          _val_3 = 0.0;
          mark = _ref + 0x10;
          w = (uint64_t)end_local;
          end_local = flatcc_json_parser_double
                                ((flatcc_json_parser_t *)buf_local,end_local,
                                 (char *)struct_base_local,(double *)&val_3);
          if (((char *)w == end_local) &&
             ((w = (uint64_t)end_local,
              end_local = flatcc_json_parser_symbolic_double
                                    ((flatcc_json_parser_t *)buf_local,end_local,
                                     (char *)struct_base_local,
                                     MyGame_Example_Vec3_parse_json_struct_inline::
                                     symbolic_parsers_1,(double *)&val_3), end_local == (char *)w ||
              (end_local == (char *)struct_base_local)))) goto LAB_0010f49d;
          flatbuffers_double_write_to_pe(mark,_val_3);
        }
      }
      else {
        end_local = flatcc_json_parser_unmatched_symbol
                              ((flatcc_json_parser_t *)buf_local,end_local,(char *)struct_base_local
                              );
      }
    }
    else if (uStack_50 < 0x7800000000000000) {
      if ((uStack_50 & 0xffffffffff000000) == 0x7465737433000000) {
        w = (uint64_t)end_local;
        end_local = flatcc_json_parser_match_symbol
                              ((flatcc_json_parser_t *)buf_local,end_local,(char *)struct_base_local
                               ,5);
        if ((char *)w == end_local) {
          end_local = flatcc_json_parser_unmatched_symbol
                                ((flatcc_json_parser_t *)buf_local,end_local,
                                 (char *)struct_base_local);
        }
        else {
          mark = _ref + 0x1a;
          end_local = MyGame_Example_Test_parse_json_struct_inline
                                ((flatcc_json_parser_t *)buf_local,end_local,
                                 (char *)struct_base_local,mark);
        }
      }
      else {
        end_local = flatcc_json_parser_unmatched_symbol
                              ((flatcc_json_parser_t *)buf_local,end_local,(char *)struct_base_local
                              );
      }
    }
    else if (uStack_50 < 0x7900000000000000) {
      if ((uStack_50 & 0xff00000000000000) == 0x7800000000000000) {
        w = (uint64_t)end_local;
        end_local = flatcc_json_parser_match_symbol
                              ((flatcc_json_parser_t *)buf_local,end_local,(char *)struct_base_local
                               ,1);
        if ((char *)w == end_local) {
          end_local = flatcc_json_parser_unmatched_symbol
                                ((flatcc_json_parser_t *)buf_local,end_local,
                                 (char *)struct_base_local);
        }
        else {
          val_4 = 0.0;
          mark = _ref;
          w = (uint64_t)end_local;
          end_local = flatcc_json_parser_float
                                ((flatcc_json_parser_t *)buf_local,end_local,
                                 (char *)struct_base_local,&val_4);
          if (((char *)w == end_local) &&
             ((w = (uint64_t)end_local,
              end_local = flatcc_json_parser_symbolic_float
                                    ((flatcc_json_parser_t *)buf_local,end_local,
                                     (char *)struct_base_local,
                                     MyGame_Example_Vec3_parse_json_struct_inline::
                                     symbolic_parsers_2,&val_4), end_local == (char *)w ||
              (end_local == (char *)struct_base_local)))) goto LAB_0010f49d;
          flatbuffers_float_write_to_pe(mark,val_4);
        }
      }
      else {
        end_local = flatcc_json_parser_unmatched_symbol
                              ((flatcc_json_parser_t *)buf_local,end_local,(char *)struct_base_local
                              );
      }
    }
    else if ((uStack_50 & 0xff00000000000000) == 0x7a00000000000000) {
      w = (uint64_t)end_local;
      end_local = flatcc_json_parser_match_symbol
                            ((flatcc_json_parser_t *)buf_local,end_local,(char *)struct_base_local,1
                            );
      if ((char *)w == end_local) {
        end_local = flatcc_json_parser_unmatched_symbol
                              ((flatcc_json_parser_t *)buf_local,end_local,(char *)struct_base_local
                              );
      }
      else {
        local_68 = 0.0;
        mark = _ref + 8;
        w = (uint64_t)end_local;
        end_local = flatcc_json_parser_float
                              ((flatcc_json_parser_t *)buf_local,end_local,(char *)struct_base_local
                               ,&local_68);
        if (((char *)w == end_local) &&
           ((w = (uint64_t)end_local,
            end_local = flatcc_json_parser_symbolic_float
                                  ((flatcc_json_parser_t *)buf_local,end_local,
                                   (char *)struct_base_local,
                                   MyGame_Example_Vec3_parse_json_struct_inline::symbolic_parsers_3,
                                   &local_68), end_local == (char *)w ||
            (end_local == (char *)struct_base_local)))) goto LAB_0010f49d;
        flatbuffers_float_write_to_pe(mark,local_68);
      }
    }
    else if ((uStack_50 & 0xff00000000000000) == 0x7900000000000000) {
      w = (uint64_t)end_local;
      end_local = flatcc_json_parser_match_symbol
                            ((flatcc_json_parser_t *)buf_local,end_local,(char *)struct_base_local,1
                            );
      if ((char *)w == end_local) {
        end_local = flatcc_json_parser_unmatched_symbol
                              ((flatcc_json_parser_t *)buf_local,end_local,(char *)struct_base_local
                              );
      }
      else {
        local_6c = 0.0;
        mark = _ref + 4;
        w = (uint64_t)end_local;
        end_local = flatcc_json_parser_float
                              ((flatcc_json_parser_t *)buf_local,end_local,(char *)struct_base_local
                               ,&local_6c);
        if (((char *)w == end_local) &&
           ((w = (uint64_t)end_local,
            end_local = flatcc_json_parser_symbolic_float
                                  ((flatcc_json_parser_t *)buf_local,end_local,
                                   (char *)struct_base_local,
                                   MyGame_Example_Vec3_parse_json_struct_inline::symbolic_parsers_4,
                                   &local_6c), end_local == (char *)w ||
            (end_local == (char *)struct_base_local)))) goto LAB_0010f49d;
        flatbuffers_float_write_to_pe(mark,local_6c);
      }
    }
    else {
      end_local = flatcc_json_parser_unmatched_symbol
                            ((flatcc_json_parser_t *)buf_local,end_local,(char *)struct_base_local);
    }
    end_local = flatcc_json_parser_object_end
                          ((flatcc_json_parser_t *)buf_local,end_local,(char *)struct_base_local,
                           (int *)((long)&pval + 4));
  } while( true );
}

Assistant:

static const char *MyGame_Example_Vec3_parse_json_struct_inline(flatcc_json_parser_t *ctx, const char *buf, const char *end, void *struct_base)
{
    int more;
    flatcc_builder_ref_t ref;
    void *pval;
    const char *mark;
    uint64_t w;

    buf = flatcc_json_parser_object_start(ctx, buf, end, &more);
    while (more) {
        buf = flatcc_json_parser_symbol_start(ctx, buf, end);
        w = flatcc_json_parser_symbol_part(buf, end);
        if (w < 0x7465737433000000) { /* branch "test3" */
            if ((w & 0xffffffffff000000) == 0x7465737432000000) { /* "test2" */
                buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 5);
                if (mark != buf) {
                    int8_t val = 0;
                    static flatcc_json_parser_integral_symbol_f *symbolic_parsers[] = {
                            MyGame_Example_Color_parse_json_enum,
                            monster_test_local_MyGame_Example_json_parser_enum,
                            monster_test_global_json_parser_enum, 0 };
                    pval = (void *)((size_t)struct_base + 24);
                    buf = flatcc_json_parser_int8(ctx, (mark = buf), end, &val);
                    if (mark == buf) {
                        buf = flatcc_json_parser_symbolic_int8(ctx, (mark = buf), end, symbolic_parsers, &val);
                        if (buf == mark || buf == end) goto failed;
                    }
                    flatbuffers_int8_write_to_pe(pval, val);
                } else {
                    buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                }
            } else { /* "test2" */
                if ((w & 0xffffffffff000000) == 0x7465737431000000) { /* "test1" */
                    buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 5);
                    if (mark != buf) {
                        double val = 0;
                        static flatcc_json_parser_integral_symbol_f *symbolic_parsers[] = {
                                monster_test_local_MyGame_Example_json_parser_enum,
                                monster_test_global_json_parser_enum, 0 };
                        pval = (void *)((size_t)struct_base + 16);
                        buf = flatcc_json_parser_double(ctx, (mark = buf), end, &val);
                        if (mark == buf) {
                            buf = flatcc_json_parser_symbolic_double(ctx, (mark = buf), end, symbolic_parsers, &val);
                            if (buf == mark || buf == end) goto failed;
                        }
                        flatbuffers_double_write_to_pe(pval, val);
                    } else {
                        buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                    }
                } else { /* "test1" */
                    buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                } /* "test1" */
            } /* "test2" */
        } else { /* branch "test3" */
            if (w < 0x7800000000000000) { /* branch "x" */
                if ((w & 0xffffffffff000000) == 0x7465737433000000) { /* "test3" */
                    buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 5);
                    if (mark != buf) {
                        pval = (void *)((size_t)struct_base + 26);
                        buf = MyGame_Example_Test_parse_json_struct_inline(ctx, buf, end, pval);
                    } else {
                        buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                    }
                } else { /* "test3" */
                    buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                } /* "test3" */
            } else { /* branch "x" */
                if (w < 0x7900000000000000) { /* branch "y" */
                    if ((w & 0xff00000000000000) == 0x7800000000000000) { /* "x" */
                        buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 1);
                        if (mark != buf) {
                            float val = 0;
                            static flatcc_json_parser_integral_symbol_f *symbolic_parsers[] = {
                                    monster_test_local_MyGame_Example_json_parser_enum,
                                    monster_test_global_json_parser_enum, 0 };
                            pval = (void *)((size_t)struct_base + 0);
                            buf = flatcc_json_parser_float(ctx, (mark = buf), end, &val);
                            if (mark == buf) {
                                buf = flatcc_json_parser_symbolic_float(ctx, (mark = buf), end, symbolic_parsers, &val);
                                if (buf == mark || buf == end) goto failed;
                            }
                            flatbuffers_float_write_to_pe(pval, val);
                        } else {
                            buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                        }
                    } else { /* "x" */
                        buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                    } /* "x" */
                } else { /* branch "y" */
                    if ((w & 0xff00000000000000) == 0x7a00000000000000) { /* "z" */
                        buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 1);
                        if (mark != buf) {
                            float val = 0;
                            static flatcc_json_parser_integral_symbol_f *symbolic_parsers[] = {
                                    monster_test_local_MyGame_Example_json_parser_enum,
                                    monster_test_global_json_parser_enum, 0 };
                            pval = (void *)((size_t)struct_base + 8);
                            buf = flatcc_json_parser_float(ctx, (mark = buf), end, &val);
                            if (mark == buf) {
                                buf = flatcc_json_parser_symbolic_float(ctx, (mark = buf), end, symbolic_parsers, &val);
                                if (buf == mark || buf == end) goto failed;
                            }
                            flatbuffers_float_write_to_pe(pval, val);
                        } else {
                            buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                        }
                    } else { /* "z" */
                        if ((w & 0xff00000000000000) == 0x7900000000000000) { /* "y" */
                            buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 1);
                            if (mark != buf) {
                                float val = 0;
                                static flatcc_json_parser_integral_symbol_f *symbolic_parsers[] = {
                                        monster_test_local_MyGame_Example_json_parser_enum,
                                        monster_test_global_json_parser_enum, 0 };
                                pval = (void *)((size_t)struct_base + 4);
                                buf = flatcc_json_parser_float(ctx, (mark = buf), end, &val);
                                if (mark == buf) {
                                    buf = flatcc_json_parser_symbolic_float(ctx, (mark = buf), end, symbolic_parsers, &val);
                                    if (buf == mark || buf == end) goto failed;
                                }
                                flatbuffers_float_write_to_pe(pval, val);
                            } else {
                                buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                            }
                        } else { /* "y" */
                            buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                        } /* "y" */
                    } /* "z" */
                } /* branch "y" */
            } /* branch "x" */
        } /* branch "test3" */
        buf = flatcc_json_parser_object_end(ctx, buf, end , &more);
    }
    return buf;
failed:
    return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_runtime);
}